

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelDiscrete.cpp
# Opt level: O1

string * __thiscall
ObservationModelDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,ObservationModelDiscrete *this)

{
  ostream *poVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"jo\tja\ts\'\tP (tuples with P==0 are not printed)",0x2d);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  std::ostream::put((char)local_1a8);
  dVar6 = (double)std::ostream::flush();
  if (0 < this->_m_nrJointObservations) {
    uVar4 = 0;
    do {
      if (0 < this->_m_nrJointActions) {
        uVar5 = 0;
        do {
          if (0 < this->_m_nrStates) {
            uVar3 = 0;
            do {
              (*(this->super_ObservationModelDiscreteInterface).super_ObservationModel.
                _vptr_ObservationModel[4])(this,uVar5,uVar3,uVar4);
              if (0.0 < dVar6) {
                poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
                poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)uVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
                poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)uVar3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
                poVar1 = std::ostream::_M_insert<double>(dVar6);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
                std::ostream::put((char)poVar1);
                dVar6 = (double)std::ostream::flush();
              }
              uVar2 = (int)uVar3 + 1;
              uVar3 = (ulong)uVar2;
            } while ((int)uVar2 < this->_m_nrStates);
          }
          uVar2 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar2;
        } while ((int)uVar2 < this->_m_nrJointActions);
      }
      uVar2 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar2;
    } while ((int)uVar2 < this->_m_nrJointObservations);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string ObservationModelDiscrete::SoftPrint() const
{
    stringstream ss;
    double p;
    ss << "jo\tja\ts'\tP (tuples with P==0 are not printed)"<<endl;
    for(int jo_i = 0; jo_i < _m_nrJointObservations; jo_i++)
        for(int ja_i = 0; ja_i < _m_nrJointActions; ja_i++)
            for(int s_ip = 0; s_ip < _m_nrStates; s_ip++)
            {
                p=Get(ja_i, s_ip, jo_i);
                if(p>0)
                    ss << jo_i << "\t" << ja_i << "\t" << s_ip << "\t" << p
                         << endl;
            }
    return(ss.str());
}